

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_specialization_constants_and_structs(CompilerHLSL *this)

{
  SpecializationConstant *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  Types TVar5;
  uint32_t uVar6;
  SPIRConstant *pSVar7;
  SPIRType *pSVar8;
  string *ts_1;
  SPIRConstantOp *pSVar9;
  size_type sVar10;
  SPIRUndef *pSVar11;
  bool local_3ca;
  string local_300 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0 [32];
  spirv_cross local_2a0 [32];
  string local_280 [8];
  string initializer;
  SPIRType *type_3;
  SPIRUndef *undef;
  key_type local_23c;
  ID IStack_238;
  bool is_buffer_block;
  bool local_231;
  SPIRType *pSStack_230;
  bool is_non_io_block;
  SPIRType *type_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [32];
  string local_1e8 [8];
  string name_1;
  SPIRType *type_1;
  SPIRConstantOp *c_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178 [32];
  undefined1 local_158 [40];
  undefined1 local_130 [48];
  string name;
  SPIRType *type;
  SPIRConstant *local_c0;
  SPIRConstant *c;
  Variant *id;
  TypedID<(spirv_cross::Types)0> *id_;
  TypedID<(spirv_cross::Types)0> *__end1;
  TypedID<(spirv_cross::Types)0> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range1;
  LoopLock loop_lock;
  anon_class_16_2_1717cda9 local_78;
  undefined1 local_68 [8];
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)1>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>_>
  io_block_types;
  ID workgroup_size_id;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  bool emitted;
  CompilerHLSL *this_local;
  
  bVar1 = false;
  SpecializationConstant::SpecializationConstant(&wg_y);
  SpecializationConstant::SpecializationConstant(&wg_z);
  this_00 = (SpecializationConstant *)((long)&io_block_types._M_h._M_single_bucket + 4);
  SpecializationConstant::SpecializationConstant(this_00);
  uVar4 = Compiler::get_work_group_size_specialization_constants
                    ((Compiler *)this,&wg_y,&wg_z,this_00);
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)&io_block_types._M_h._M_single_bucket,uVar4);
  ::std::
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)1>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>_>
  ::unordered_set((unordered_set<spirv_cross::TypedID<(spirv_cross::Types)1>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>_>
                   *)local_68);
  local_78.this = this;
  local_78.io_block_types =
       (unordered_set<spirv_cross::TypedID<(spirv_cross::Types)1>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>_>
        *)local_68;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerHLSL::emit_specialization_constants_and_structs()::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&local_78);
  ParsedIR::create_loop_hard_lock((ParsedIR *)&__range1);
  __begin1 = (TypedID<(spirv_cross::Types)0> *)
             &(this->super_CompilerGLSL).super_Compiler.ir.ids_for_constant_undef_or_type;
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                     ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin1);
  id_ = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                  ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin1);
  for (; __end1 != id_; __end1 = __end1 + 1) {
    id = (Variant *)__end1;
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    c = (SPIRConstant *)
        VectorView<spirv_cross::Variant>::operator[]
                  (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>,(ulong)uVar4);
    TVar5 = Variant::get_type((Variant *)c);
    if (TVar5 == TypeConstant) {
      local_c0 = Variant::get<spirv_cross::SPIRConstant>((Variant *)c);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_c0->super_IVariant).self);
      uVar6 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&io_block_types._M_h._M_single_bucket);
      if (uVar4 == uVar6) {
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&io_block_types._M_h._M_single_bucket);
        pSVar7 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,uVar4);
        CompilerGLSL::constant_expression_abi_cxx11_
                  ((CompilerGLSL *)&type,(SPIRConstant *)this,SUB81(pSVar7,0),false);
        CompilerGLSL::statement<char_const(&)[39],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [39])"static const uint3 gl_WorkGroupSize = "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                   (char (*) [2])0x42463b);
        ::std::__cxx11::string::~string((string *)&type);
        bVar1 = true;
      }
      else if ((local_c0->specialization & 1U) != 0) {
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(local_c0->super_IVariant).field_0xc);
        pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_c0->super_IVariant).self);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar4);
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_c0->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_130 + 0x28,this,(ulong)uVar4,1);
        local_130._36_4_ = (local_c0->super_IVariant).self.id;
        bVar1 = Compiler::has_decoration((Compiler *)this,(ID)local_130._36_4_,DecorationSpecId);
        if (bVar1) {
          local_158._36_4_ = (local_c0->super_IVariant).self.id;
          Compiler::get_decoration((Compiler *)this,(ID)local_158._36_4_,DecorationSpecId);
          CompilerGLSL::constant_value_macro_name_abi_cxx11_
                    ((CompilerGLSL *)local_130,(uint32_t)this);
          ::std::__cxx11::string::operator=
                    ((string *)&local_c0->specialization_constant_macro_name,(string *)local_130);
          ::std::__cxx11::string::~string((string *)local_130);
          CompilerGLSL::statement<char_const(&)[9],std::__cxx11::string&>
                    (&this->super_CompilerGLSL,(char (*) [9])"#ifndef ",
                     &local_c0->specialization_constant_macro_name);
          ts_1 = &local_c0->specialization_constant_macro_name;
          CompilerGLSL::constant_expression_abi_cxx11_
                    ((CompilerGLSL *)local_158,(SPIRConstant *)this,SUB81(local_c0,0),false);
          CompilerGLSL::
          statement<char_const(&)[9],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string>
                    (&this->super_CompilerGLSL,(char (*) [9])"#define ",ts_1,(char (*) [2])0x40c6cb,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158)
          ;
          ::std::__cxx11::string::~string((string *)local_158);
          CompilerGLSL::statement<char_const(&)[7]>
                    (&this->super_CompilerGLSL,(char (*) [7])"#endif");
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                    (local_178,this,pSVar8,local_130 + 0x28,0);
          CompilerGLSL::
          statement<char_const(&)[14],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [14])"static const ",local_178,
                     (char (*) [4])0x4247a7,&local_c0->specialization_constant_macro_name,
                     (char (*) [2])0x42463b);
          ::std::__cxx11::string::~string((string *)local_178);
        }
        else {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                    (local_198,this,pSVar8,local_130 + 0x28);
          CompilerGLSL::constant_expression_abi_cxx11_
                    ((CompilerGLSL *)&c_1,(SPIRConstant *)this,SUB81(local_c0,0),false);
          CompilerGLSL::
          statement<char_const(&)[14],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [14])"static const ",local_198,
                     (char (*) [4])0x4247a7,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c_1,
                     (char (*) [2])0x42463b);
          ::std::__cxx11::string::~string((string *)&c_1);
          ::std::__cxx11::string::~string((string *)local_198);
        }
        bVar1 = true;
        ::std::__cxx11::string::~string((string *)(local_130 + 0x28));
      }
    }
    else {
      TVar5 = Variant::get_type((Variant *)c);
      if (TVar5 == TypeConstantOp) {
        pSVar9 = Variant::get<spirv_cross::SPIRConstantOp>((Variant *)c);
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar9->basetype);
        pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar9->super_IVariant).self);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar4);
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar9->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_1e8,this,(ulong)uVar4,1);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                  (local_208,this,pSVar8,local_1e8,0);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x18])(&type_2,this,pSVar9);
        CompilerGLSL::
        statement<char_const(&)[14],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [14])"static const ",local_208,
                   (char (*) [4])0x4247a7,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type_2,
                   (char (*) [2])0x42463b);
        ::std::__cxx11::string::~string((string *)&type_2);
        ::std::__cxx11::string::~string((string *)local_208);
        bVar1 = true;
        ::std::__cxx11::string::~string(local_1e8);
      }
      else {
        TVar5 = Variant::get_type((Variant *)c);
        if (TVar5 == TypeType) {
          pSStack_230 = Variant::get<spirv_cross::SPIRType>((Variant *)c);
          IStack_238.id = (pSStack_230->super_IVariant).self.id;
          bVar2 = Compiler::has_decoration((Compiler *)this,IStack_238,DecorationBlock);
          local_3ca = false;
          if (bVar2) {
            local_23c.id = (uint32_t)
                           TypedID::operator_cast_to_TypedID
                                     ((TypedID *)&(pSStack_230->super_IVariant).self);
            sVar10 = ::std::
                     unordered_set<spirv_cross::TypedID<(spirv_cross::Types)1>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>_>
                     ::count((unordered_set<spirv_cross::TypedID<(spirv_cross::Types)1>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>_>
                              *)local_68,&local_23c);
            local_3ca = sVar10 == 0;
          }
          local_231 = local_3ca;
          bVar2 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(pSStack_230->super_IVariant).self.id,
                             DecorationBufferBlock);
          if ((((pSStack_230->basetype == Struct) &&
               (bVar3 = VectorView<unsigned_int>::empty
                                  (&(pSStack_230->array).super_VectorView<unsigned_int>), bVar3)) &&
              ((pSStack_230->pointer & 1U) == 0)) && (((local_231 & 1U) == 0 && (!bVar2)))) {
            if (bVar1) {
              CompilerGLSL::statement<char_const(&)[1]>
                        (&this->super_CompilerGLSL,(char (*) [1])0x400321);
            }
            bVar1 = false;
            CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSStack_230);
          }
        }
        else {
          TVar5 = Variant::get_type((Variant *)c);
          if (TVar5 == TypeUndef) {
            pSVar11 = Variant::get<spirv_cross::SPIRUndef>((Variant *)c);
            uVar4 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar11->super_IVariant).field_0xc);
            pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
            if (pSVar8->basetype == Void) goto LAB_0023cfaf;
            ::std::__cxx11::string::string(local_280);
            if ((((this->super_CompilerGLSL).options.force_zero_initialized_variables & 1U) != 0) &&
               (bVar1 = CompilerGLSL::type_can_zero_initialize(&this->super_CompilerGLSL,pSVar8),
               bVar1)) {
              uVar4 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(pSVar11->super_IVariant).field_0xc);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3b])
                        (local_2c0,this,(ulong)uVar4);
              join<char_const(&)[4],std::__cxx11::string>
                        (local_2a0,(char (*) [4])0x4247a7,local_2c0);
              ::std::__cxx11::string::operator=(local_280,(string *)local_2a0);
              ::std::__cxx11::string::~string((string *)local_2a0);
              ::std::__cxx11::string::~string((string *)local_2c0);
            }
            uVar4 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar11->super_IVariant).self);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (local_300,this,(ulong)uVar4,1);
            uVar4 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar11->super_IVariant).self);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                      (local_2e0,this,pSVar8,local_300,(ulong)uVar4);
            CompilerGLSL::
            statement<char_const(&)[8],std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [8])"static ",local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_280,(char (*) [2])0x42463b);
            ::std::__cxx11::string::~string((string *)local_2e0);
            ::std::__cxx11::string::~string(local_300);
            bVar1 = true;
            ::std::__cxx11::string::~string(local_280);
          }
        }
      }
    }
  }
  if (bVar1) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x400321);
  }
LAB_0023cfaf:
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&__range1);
  ::std::
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)1>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>_>
  ::~unordered_set((unordered_set<spirv_cross::TypedID<(spirv_cross::Types)1>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>_>
                    *)local_68);
  return;
}

Assistant:

void CompilerHLSL::emit_specialization_constants_and_structs()
{
	bool emitted = false;
	SpecializationConstant wg_x, wg_y, wg_z;
	ID workgroup_size_id = get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

	std::unordered_set<TypeID> io_block_types;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		if ((var.storage == StorageClassInput || var.storage == StorageClassOutput) &&
		    !var.remapped_variable && type.pointer && !is_builtin_variable(var) &&
		    interface_variable_exists_in_entry_point(var.self) &&
		    has_decoration(type.self, DecorationBlock))
		{
			io_block_types.insert(type.self);
		}
	});

	auto loop_lock = ir.create_loop_hard_lock();
	for (auto &id_ : ir.ids_for_constant_undef_or_type)
	{
		auto &id = ir.ids[id_];

		if (id.get_type() == TypeConstant)
		{
			auto &c = id.get<SPIRConstant>();

			if (c.self == workgroup_size_id)
			{
				statement("static const uint3 gl_WorkGroupSize = ",
				          constant_expression(get<SPIRConstant>(workgroup_size_id)), ";");
				emitted = true;
			}
			else if (c.specialization)
			{
				auto &type = get<SPIRType>(c.constant_type);
				add_resource_name(c.self);
				auto name = to_name(c.self);

				if (has_decoration(c.self, DecorationSpecId))
				{
					// HLSL does not support specialization constants, so fallback to macros.
					c.specialization_constant_macro_name =
							constant_value_macro_name(get_decoration(c.self, DecorationSpecId));

					statement("#ifndef ", c.specialization_constant_macro_name);
					statement("#define ", c.specialization_constant_macro_name, " ", constant_expression(c));
					statement("#endif");
					statement("static const ", variable_decl(type, name), " = ", c.specialization_constant_macro_name, ";");
				}
				else
					statement("static const ", variable_decl(type, name), " = ", constant_expression(c), ";");

				emitted = true;
			}
		}
		else if (id.get_type() == TypeConstantOp)
		{
			auto &c = id.get<SPIRConstantOp>();
			auto &type = get<SPIRType>(c.basetype);
			add_resource_name(c.self);
			auto name = to_name(c.self);
			statement("static const ", variable_decl(type, name), " = ", constant_op_expression(c), ";");
			emitted = true;
		}
		else if (id.get_type() == TypeType)
		{
			auto &type = id.get<SPIRType>();
			bool is_non_io_block = has_decoration(type.self, DecorationBlock) &&
			                       io_block_types.count(type.self) == 0;
			bool is_buffer_block = has_decoration(type.self, DecorationBufferBlock);
			if (type.basetype == SPIRType::Struct && type.array.empty() &&
			    !type.pointer && !is_non_io_block && !is_buffer_block)
			{
				if (emitted)
					statement("");
				emitted = false;

				emit_struct(type);
			}
		}
		else if (id.get_type() == TypeUndef)
		{
			auto &undef = id.get<SPIRUndef>();
			auto &type = this->get<SPIRType>(undef.basetype);
			// OpUndef can be void for some reason ...
			if (type.basetype == SPIRType::Void)
				return;

			string initializer;
			if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
				initializer = join(" = ", to_zero_initialized_expression(undef.basetype));

			statement("static ", variable_decl(type, to_name(undef.self), undef.self), initializer, ";");
			emitted = true;
		}
	}

	if (emitted)
		statement("");
}